

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

bool __thiscall
Hospital::Existence_Of_Phone_Number
          (Hospital *this,string *Phone_Number,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  undefined1 local_b0 [40];
  undefined1 local_88 [4];
  int i_2;
  int local_64;
  undefined1 local_60 [4];
  int i_1;
  int local_3c;
  vector<Patient,_std::allocator<Patient>_> *pvStack_38;
  int i;
  vector<Patient,_std::allocator<Patient>_> *All_Of_Patients_local;
  vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors_local;
  vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses_local;
  string *Phone_Number_local;
  Hospital *this_local;
  
  local_3c = 0;
  pvStack_38 = All_Of_Patients;
  All_Of_Patients_local = (vector<Patient,_std::allocator<Patient>_> *)All_Of_Doctors;
  All_Of_Doctors_local = (vector<Doctor,_std::allocator<Doctor>_> *)All_Of_Nurses;
  All_Of_Nurses_local = (vector<Nurse,_std::allocator<Nurse>_> *)Phone_Number;
  Phone_Number_local = &this->Admin_Username;
  while( true ) {
    uVar2 = (ulong)local_3c;
    sVar3 = std::vector<Nurse,_std::allocator<Nurse>_>::size(All_Of_Nurses);
    if (sVar3 <= uVar2) {
      local_64 = 0;
      while( true ) {
        uVar2 = (ulong)local_64;
        sVar3 = std::vector<Doctor,_std::allocator<Doctor>_>::size(All_Of_Doctors);
        if (sVar3 <= uVar2) {
          local_b0._36_4_ = 0;
          while( true ) {
            uVar2 = (ulong)(int)local_b0._36_4_;
            sVar3 = std::vector<Patient,_std::allocator<Patient>_>::size(All_Of_Patients);
            if (sVar3 <= uVar2) {
              return false;
            }
            std::vector<Patient,_std::allocator<Patient>_>::operator[]
                      (All_Of_Patients,(long)(int)local_b0._36_4_);
            Human::Phone_number_Getter_abi_cxx11_((Human *)local_b0);
            _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b0,Phone_Number);
            std::__cxx11::string::~string((string *)local_b0);
            if (_Var1) break;
            local_b0._36_4_ = local_b0._36_4_ + 1;
          }
          return true;
        }
        std::vector<Doctor,_std::allocator<Doctor>_>::operator[](All_Of_Doctors,(long)local_64);
        Human::Phone_number_Getter_abi_cxx11_((Human *)local_88);
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,Phone_Number);
        std::__cxx11::string::~string((string *)local_88);
        if (_Var1) break;
        local_64 = local_64 + 1;
      }
      return true;
    }
    std::vector<Nurse,_std::allocator<Nurse>_>::operator[](All_Of_Nurses,(long)local_3c);
    Human::Phone_number_Getter_abi_cxx11_((Human *)local_60);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60,Phone_Number);
    std::__cxx11::string::~string((string *)local_60);
    if (_Var1) break;
    local_3c = local_3c + 1;
  }
  return true;
}

Assistant:

bool Hospital:: Existence_Of_Phone_Number (string Phone_Number , vector<Nurse> All_Of_Nurses , vector<Doctor> All_Of_Doctors , vector<Patient>All_Of_Patients ){

    for (int i = 0; i <All_Of_Nurses.size() ; ++i) {
        if (All_Of_Nurses[i].Phone_number_Getter() == Phone_Number) return true;
    }
    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if (All_Of_Doctors[i].Phone_number_Getter() == Phone_Number) return true;
    }
    for (int i = 0; i <All_Of_Patients.size() ; ++i) {
        if (All_Of_Patients[i].Phone_number_Getter() == Phone_Number) return true;
    }
    return false;
}